

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

Clifford * operator!(Clifford *__return_storage_ptr__,Clifford *A)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  bool bVar9;
  pointer pBVar10;
  uint uVar11;
  Blade local_3c;
  int local_34;
  iterator iStack_30;
  int r;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_28;
  idx a;
  float s;
  Clifford *A_local;
  Clifford *R;
  
  a._M_current._4_4_ = 1.0;
  a._M_current._3_1_ = 0;
  std::vector<Blade,_std::allocator<Blade>_>::vector(__return_storage_ptr__);
  local_28._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(A);
  while( true ) {
    iStack_30 = std::vector<Blade,_std::allocator<Blade>_>::end(A);
    bVar9 = __gnu_cxx::operator!=(&local_28,&stack0xffffffffffffffd0);
    if (!bVar9) break;
    pBVar10 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
              operator->(&local_28);
    iVar1 = pBVar10->mBase;
    pBVar10 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
              operator->(&local_28);
    iVar2 = pBVar10->mBase;
    pBVar10 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
              operator->(&local_28);
    iVar3 = pBVar10->mBase;
    pBVar10 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
              operator->(&local_28);
    iVar4 = pBVar10->mBase;
    pBVar10 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
              operator->(&local_28);
    iVar5 = pBVar10->mBase;
    pBVar10 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
              operator->(&local_28);
    iVar6 = pBVar10->mBase;
    pBVar10 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
              operator->(&local_28);
    iVar7 = pBVar10->mBase;
    pBVar10 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
              operator->(&local_28);
    uVar11 = ((((iVar1 - (iVar2 >> 1 & 0x77777777U)) - (iVar3 >> 2 & 0x33333333U)) -
              (iVar4 >> 3 & 0x11111111U)) +
              ((int)(((iVar5 - (iVar6 >> 1 & 0x77777777U)) - (iVar7 >> 2 & 0x33333333U)) -
                    (pBVar10->mBase >> 3 & 0x11111111U)) >> 4) & 0xf0f0f0f) % 0xff;
    local_34 = uVar11 * (uVar11 + 1);
    if ((local_34 >> 1 & 1U) != 0) {
      a._M_current._4_4_ = -1.0;
    }
    pBVar10 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
              operator->(&local_28);
    fVar8 = a._M_current._4_4_;
    iVar1 = pBVar10->mBase;
    pBVar10 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
              operator->(&local_28);
    Blade::Blade(&local_3c,iVar1,fVar8 * pBVar10->mVal);
    std::vector<Blade,_std::allocator<Blade>_>::push_back(__return_storage_ptr__,&local_3c);
    Blade::~Blade(&local_3c);
    __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::operator++
              (&local_28,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator!(Clifford A)
{	float s=1;
	Clifford R;
	idx a=A.begin();
	while(a!=A.end())
	{	
		int r;
		r=bits(a->mBase);
		r=r*(r+1);
		if((r>>1)&1){s=-1;}
		R.push_back(Blade(a->mBase,s*a->mVal));
		a++;
	}
	return R;
}